

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws_dll2.c
# Opt level: O2

void lws_dll2_add_head(lws_dll2 *d,lws_dll2_owner *owner)

{
  int iVar1;
  lws_dll2 *plVar2;
  
  iVar1 = lws_dll2_is_detached(d);
  if (iVar1 != 0) {
    plVar2 = owner->head;
    if (plVar2 == d) {
      plVar2 = d->next;
    }
    else {
      d->next = plVar2;
    }
    if (plVar2 != (lws_dll2 *)0x0) {
      plVar2->prev = d;
    }
    d->prev = (lws_dll2 *)0x0;
    owner->head = d;
    if (owner->tail == (lws_dll2 *)0x0) {
      owner->tail = d;
    }
    d->owner = owner;
    owner->count = owner->count + 1;
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core/lws_dll2.c"
                ,0x48,"void lws_dll2_add_head(struct lws_dll2 *, struct lws_dll2_owner *)");
}

Assistant:

void
lws_dll2_add_head(struct lws_dll2 *d, struct lws_dll2_owner *owner)
{
	if (!lws_dll2_is_detached(d)) {
		assert(0); /* only wholly detached things can be added */
		return;
	}

	/* our next guy is current first guy, if any */
	if (owner->head != d)
		d->next = owner->head;

	/* if there is a next guy, set his prev ptr to our next ptr */
	if (d->next)
		d->next->prev = d;
	/* there is nobody previous to us, we are the head */
	d->prev = NULL;

	/* set the first guy to be us */
	owner->head = d;

	if (!owner->tail)
		owner->tail = d;

	d->owner = owner;
	owner->count++;
}